

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netaddr.c
# Opt level: O0

int netaddr_to_autobuf(autobuf *abuf,netaddr *src)

{
  byte bVar1;
  uint32_t addr_len;
  netaddr *src_local;
  autobuf *abuf_local;
  
  bVar1 = netaddr_get_af_maxprefix((uint)src->_type);
  if ((int)(uint)bVar1 >> 3 == 0) {
    abuf_local._4_4_ = -1;
  }
  else {
    abuf_local._4_4_ = abuf_memcpy(abuf,src,(ulong)(uint)((int)(uint)bVar1 >> 3));
  }
  return abuf_local._4_4_;
}

Assistant:

int
netaddr_to_autobuf(struct autobuf *abuf, const struct netaddr *src) {
  uint32_t addr_len;

  addr_len = netaddr_get_maxprefix(src) >> 3;
  if (addr_len == 0) {
    /* unknown address type */
    return -1;
  }

  return abuf_memcpy(abuf, src->_addr, addr_len);
}